

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O2

vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> * __thiscall
cfd::core::Transaction::GetTxOutList
          (vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>
           *__return_storage_ptr__,Transaction *this)

{
  pointer pTVar1;
  pointer pTVar2;
  TxOut tx_out;
  AbstractTxOutReference AStack_c8;
  AbstractTxOut local_78;
  
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar1 = (this->vout_).super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (pTVar2 = (this->vout_).
                super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
                super__Vector_impl_data._M_start; pTVar2 != pTVar1; pTVar2 = pTVar2 + 1) {
    TxOut::TxOut((TxOut *)&local_78,pTVar2);
    TxOutReference::TxOutReference((TxOutReference *)&AStack_c8,(TxOut *)&local_78);
    ::std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::
    emplace_back<cfd::core::TxOutReference>(__return_storage_ptr__,(TxOutReference *)&AStack_c8);
    AbstractTxOutReference::~AbstractTxOutReference(&AStack_c8);
    AbstractTxOut::~AbstractTxOut(&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

const std::vector<TxOutReference> Transaction::GetTxOutList() const {
  std::vector<TxOutReference> refs;
  for (TxOut tx_out : vout_) {
    refs.push_back(TxOutReference(tx_out));
  }
  return refs;
}